

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffobjs.c
# Opt level: O0

void cff_face_done(FT_Face cffface)

{
  FT_Memory memory_00;
  CFF_Font_conflict font;
  CFF_Font_conflict cff;
  SFNT_Service sfnt;
  FT_Memory memory;
  CFF_Face face;
  FT_Face cffface_local;
  
  if (cffface != (FT_Face)0x0) {
    memory_00 = cffface->memory;
    if (*(long *)&cffface[3].units_per_EM != 0) {
      (**(code **)(*(long *)&cffface[3].units_per_EM + 0x18))(cffface);
    }
    font = (CFF_Font_conflict)cffface[4].bbox.yMin;
    if (font != (CFF_Font_conflict)0x0) {
      cff_font_done(font);
      ft_mem_free(memory_00,(void *)cffface[4].bbox.yMin);
      cffface[4].bbox.yMin = 0;
    }
    cff_done_blend((CFF_Face)cffface);
    cffface[4].size = (FT_Size)0x0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cff_face_done( FT_Face  cffface )         /* CFF_Face */
  {
    CFF_Face      face = (CFF_Face)cffface;
    FT_Memory     memory;
    SFNT_Service  sfnt;


    if ( !face )
      return;

    memory = cffface->memory;
    sfnt   = (SFNT_Service)face->sfnt;

    if ( sfnt )
      sfnt->done_face( face );

    {
      CFF_Font  cff = (CFF_Font)face->extra.data;


      if ( cff )
      {
        cff_font_done( cff );
        FT_FREE( face->extra.data );
      }
    }

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
    cff_done_blend( face );
    face->blend = NULL;
#endif
  }